

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-file.c
# Opt level: O0

int lws_plat_read_file(char *filename,void *buf,size_t len)

{
  int __fd;
  ssize_t sVar1;
  ssize_t n;
  int fd;
  size_t len_local;
  void *buf_local;
  char *filename_local;
  
  __fd = lws_open(filename,0);
  if (__fd == -1) {
    filename_local._4_4_ = -1;
  }
  else {
    sVar1 = read(__fd,buf,len);
    close(__fd);
    filename_local._4_4_ = (int)sVar1;
  }
  return filename_local._4_4_;
}

Assistant:

int
lws_plat_read_file(const char *filename, void *buf, size_t len)
{
	int fd = lws_open(filename, O_RDONLY);
	ssize_t n;

	if (fd == -1)
		return -1;

	n = read(fd, buf, len);
	close(fd);

	return (int)n;
}